

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *
wasm::WATParser::anon_unknown_0::str
          (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *__return_storage_ptr__,
          string_view in)

{
  undefined8 *puVar1;
  byte bVar2;
  undefined8 uVar3;
  char cVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 in_RCX [8];
  undefined *puVar7;
  undefined8 in_R8;
  ostream *poVar8;
  bool bVar9;
  bool bVar10;
  string_view in_00;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  string_view sv_08;
  string_view sv_09;
  undefined1 auStack_398 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  ios_base local_318 [264];
  undefined1 local_210 [8];
  LexStrCtx ctx;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *local_38;
  
  ctx.super_LexCtx.input._M_len = (size_t)in._M_str;
  local_210 = (undefined1  [8])in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.escapeBuilder.
  super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload.field2[0x180] = 0;
  sv._M_str = "\"";
  sv._M_len = 1;
  local_38 = __return_storage_ptr__;
  sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv);
  if (sVar5 == 0) {
LAB_00b903d6:
    (local_38->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_engaged =
         false;
  }
  else {
    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
    do {
      while( true ) {
        poVar8 = (ostream *)
                 ((long)&ctx.escapeBuilder.
                         super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 8);
        sv_00._M_str = "\"";
        sv_00._M_len = 1;
        pcVar6 = (char *)LexCtx::startsWith((LexCtx *)local_210,sv_00);
        if (pcVar6 != (char *)0x0) {
          ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
          if ((ctx.super_LexCtx.input._M_str != (char *)0x0) &&
             (pcVar6 = (char *)ctx.super_LexCtx.input._M_len, in_RCX = local_210,
             ctx.super_LexCtx.input._M_str <= (ulong)local_210)) {
            in_RCX = (undefined1  [8])ctx.super_LexCtx.input._M_str;
          }
          if (ctx.super_LexCtx.input._M_str == (char *)0x0) goto LAB_00b903d6;
          if (ctx.escapeBuilder.
              super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload.field2[0x180] == '\x01') {
            auStack_398 = in_RCX;
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.super_LexResult.span._M_len = (size_t)pcVar6;
            std::__cxx11::stringbuf::str();
            cVar4 = local_48[0];
            uVar3 = local_50;
            pcVar6 = (char *)((long)&lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload + 0x18);
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._29_3_ = SUB73(local_48._1_7_,4);
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._25_4_ = (undefined4)local_48._1_7_;
            if (local_58 == local_48) {
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_engaged = (bool)local_48[8];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _33_1_ = local_48[9];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _34_1_ = local_48[10];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _35_1_ = local_48[0xb];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _36_1_ = local_48[0xc];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _37_1_ = local_48[0xd];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _38_1_ = local_48[0xe];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _39_1_ = local_48[0xf];
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str = pcVar6;
            }
            else {
              lexed.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str = local_58;
            }
            local_50 = 0;
            local_48[0] = '\0';
            *(undefined1 (*) [8])
             &(local_38->
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
              )._M_payload.
              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
              .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
              _M_payload._M_value.super_LexResult.span = auStack_398;
            *(size_t *)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload._M_value.super_LexResult.span + 8) =
                 lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
                 _M_payload._M_value.super_LexResult.span._M_len;
            *(undefined1 *)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x30) = 0;
            puVar1 = (undefined8 *)
                     ((long)&(local_38->
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                             )._M_payload.
                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                             .
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                             ._M_payload + 0x20);
            *(undefined8 **)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x10) = puVar1;
            if (lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
                _M_payload._M_value.super_LexResult.span._M_str == pcVar6) {
              *puVar1 = CONCAT35(lexed.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                 ._M_payload._29_3_,
                                 CONCAT41(lexed.
                                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                          ._M_payload.
                                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                          ._M_payload._25_4_,cVar4));
              *(undefined8 *)
               ((long)&(local_38->
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                       )._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                       ._M_payload + 0x28) =
                   lexed.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                   ._32_8_;
            }
            else {
              *(char **)((long)&(local_38->
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                )._M_payload.
                                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                .
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                ._M_payload + 0x10) =
                   lexed.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                   ._M_payload._M_value.super_LexResult.span._M_str;
              *(ulong *)((long)&(local_38->
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                )._M_payload.
                                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                .
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                ._M_payload + 0x20) =
                   CONCAT35(lexed.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                            ._M_payload._29_3_,
                            CONCAT41(lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._25_4_,cVar4));
            }
            *(undefined8 *)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x18) = uVar3;
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.n._0_5_ = 0;
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._21_4_ = 0;
            *(undefined1 *)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x30) = 1;
            (local_38->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            )._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_engaged = true;
            lexed.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
            _M_payload._M_value.super_LexResult.span._M_str = pcVar6;
            local_58 = local_48;
          }
          else {
            *(undefined1 (*) [8])
             &(local_38->
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
              )._M_payload.
              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
              .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
              _M_payload._M_value.super_LexResult.span = in_RCX;
            *(char **)((long)&(local_38->
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                              )._M_payload.
                              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                              .
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                              ._M_payload._M_value.super_LexResult.span + 8) = pcVar6;
            *(undefined1 *)
             ((long)&(local_38->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x30) = 0;
            (local_38->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            )._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_engaged = true;
          }
          goto LAB_00b903de;
        }
        if (local_210 == (undefined1  [8])ctx.super_LexCtx.input._M_str) goto LAB_00b903d6;
        sv_01._M_str = "\\";
        sv_01._M_len = 1;
        sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_01);
        if (sVar5 == 0) break;
        if (ctx.escapeBuilder.
            super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload.field2[0x180] == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_398);
          std::optional<std::__cxx11::stringstream>::operator=
                    ((optional<std::__cxx11::stringstream> *)&ctx.super_LexCtx.lexedSize,
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_398);
          puVar7 = &std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)auStack_398);
          std::ios_base::~ios_base(local_318);
          in_RCX = (undefined1  [8])ctx.super_LexCtx.input._M_str;
          if ((ctx.super_LexCtx.input._M_str != (char *)0x0) &&
             (puVar7 = (undefined *)ctx.super_LexCtx.input._M_len,
             (ulong)local_210 < ctx.super_LexCtx.input._M_str)) {
            in_RCX = local_210;
          }
          if (in_RCX == (undefined1  [8])0x0) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",1);
          }
          in_RCX = (undefined1  [8])((long)in_RCX + -1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,puVar7 + 1,(long)in_RCX);
        }
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
        sv_02._M_str = "t";
        sv_02._M_len = 1;
        sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_02);
        if (sVar5 == 0) {
          sv_03._M_str = "n";
          sv_03._M_len = 1;
          sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_03);
          if (sVar5 == 0) {
            sv_04._M_str = "r";
            sv_04._M_len = 1;
            sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_04);
            if (sVar5 == 0) {
              sv_05._M_str = "\\";
              sv_05._M_len = 1;
              sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_05);
              if (sVar5 == 0) {
                sv_06._M_str = "\"";
                sv_06._M_len = 1;
                sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_06);
                if (sVar5 == 0) {
                  sv_07._M_str = "\'";
                  sv_07._M_len = 1;
                  sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_07);
                  if (sVar5 == 0) {
                    sv_08._M_str = "u{";
                    sv_08._M_len = 2;
                    sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_08);
                    if (sVar5 == 0) {
                      if ((ulong)local_210 < ctx.super_LexCtx.input._M_str) {
                        std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > __size (which is %zu)",
                                   "basic_string_view::substr");
                      }
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_len =
                           (size_t)(ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len);
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str = (char *)0x0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.n._0_5_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._21_4_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._25_4_ = 0;
                      in_RCX = local_210;
                      auStack_398 = (undefined1  [8])
                                    ((long)local_210 + -(long)ctx.super_LexCtx.input._M_str);
                      bVar9 = LexIntCtx::takeHexdigit((LexIntCtx *)auStack_398);
                      if ((!bVar9) ||
                         (bVar9 = LexIntCtx::takeHexdigit((LexIntCtx *)auStack_398), !bVar9))
                      goto LAB_00b903d6;
                      if ((lexed.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                           ._M_payload._28_1_ == '\0') &&
                         (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.super_LexResult.span._M_str != (char *)0x0)) {
                        pcVar6 = (char *)CONCAT35(lexed.
                                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                                  ._M_payload._M_value.n._5_3_,
                                                  lexed.
                                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                                  ._M_payload._M_value.n._0_5_);
                        local_60 = lexed.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                   ._M_payload._M_value.super_LexResult.span._M_str;
                        if ((ulong)auStack_398 <
                            lexed.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                            ._M_payload._M_value.super_LexResult.span._M_str) {
                          local_60 = (char *)auStack_398;
                        }
                        in_RCX = (undefined1  [8])-(long)pcVar6;
                        ctx.escapeBuilder.
                        super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._392_8_ = (char *)-(long)pcVar6;
                        if (CONCAT31(lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._M_value.sign._1_3_,
                                     lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._M_value.sign._0_1_) != 2) {
                          in_RCX = (undefined1  [8])pcVar6;
                          ctx.escapeBuilder.
                          super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._392_8_ = pcVar6;
                        }
                      }
                      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + (long)local_60
                      ;
                      local_58 = (char *)CONCAT71(local_58._1_7_,
                                                  ctx.escapeBuilder.
                                                  super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_engaged);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_58,1)
                      ;
                    }
                    else {
                      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 2;
                      if ((ulong)local_210 < ctx.super_LexCtx.input._M_str) {
                        std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > __size (which is %zu)",
                                   "basic_string_view::substr");
                      }
                      in_00._M_len = ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len;
                      in_RCX = (undefined1  [8])0x0;
                      in_00._M_str = (char *)0x0;
                      hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                             auStack_398,
                             (anon_unknown_0 *)
                             ((long)local_210 + -(long)ctx.super_LexCtx.input._M_str),in_00,
                             (OverflowBehavior)in_R8);
                      if (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.sign._0_1_ == '\0') goto LAB_00b903d6;
                      ctx.super_LexCtx.input._M_str =
                           ctx.super_LexCtx.input._M_str + (long)auStack_398;
                      sv_09._M_str = "}";
                      sv_09._M_len = 1;
                      sVar5 = LexCtx::startsWith((LexCtx *)local_210,sv_09);
                      if (sVar5 == 0) goto LAB_00b903d6;
                      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                      bVar10 = ((ulong)lexed.
                                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                       ._M_payload.
                                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                       ._M_payload._M_value.super_LexResult.span._M_str &
                               0xfffffffffffff800) == 0xd800;
                      bVar9 = (char *)((long)DWORD_ARRAY_00108248 + 0x7db7U) <
                              lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_payload._M_value.super_LexResult.span._M_str;
                      if ((bVar9 || bVar10) ||
                         (String::writeWTF8CodePoint
                                    ((ostream *)
                                     ((long)&ctx.escapeBuilder.
                                             super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ._M_payload + 8),
                                     (uint32_t)
                                     lexed.
                                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                     ._M_payload._M_value.super_LexResult.span._M_str),
                         bVar9 || bVar10)) goto LAB_00b903d6;
                    }
                  }
                  else {
                    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                    auStack_398[0] = 0x27;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1)
                    ;
                  }
                }
                else {
                  ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                  auStack_398[0] = 0x22;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1);
                }
              }
              else {
                ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
                auStack_398[0] = 0x5c;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1);
              }
            }
            else {
              ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
              auStack_398[0] = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1);
            }
          }
          else {
            ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
            auStack_398[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1);
          }
        }
        else {
          ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
          auStack_398[0] = 9;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)auStack_398,1);
        }
      }
      if ((ulong)local_210 < ctx.super_LexCtx.input._M_str) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      bVar2 = ctx.super_LexCtx.input._M_str[ctx.super_LexCtx.input._M_len];
      bVar9 = 0x1f < bVar2;
      in_RCX = (undefined1  [8])CONCAT71(local_210._1_7_,bVar9);
      if (bVar2 != 0x7f && bVar9) {
        if (ctx.escapeBuilder.
            super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload.field2[0x180] == '\x01') {
          auStack_398[0] = bVar2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     ((long)&ctx.escapeBuilder.
                             super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 8),(char *)auStack_398,1);
        }
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
      }
      else {
        (local_38->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>).
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_engaged = false;
      }
    } while (bVar2 != 0x7f && bVar9);
  }
LAB_00b903de:
  std::
  _Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ctx.super_LexCtx.lexedSize);
  return local_38;
}

Assistant:

std::optional<LexStrResult> str(std::string_view in) {
  LexStrCtx ctx(in);
  if (!ctx.takePrefix("\""sv)) {
    return {};
  }
  while (!ctx.takePrefix("\""sv)) {
    if (ctx.empty()) {
      // TODO: Add error production for unterminated string.
      return {};
    }
    if (ctx.startsWith("\\"sv)) {
      // Escape sequences
      ctx.ensureBuildingEscaped();
      ctx.take(1);
      if (ctx.takePrefix("t"sv)) {
        ctx.appendEscaped('\t');
      } else if (ctx.takePrefix("n"sv)) {
        ctx.appendEscaped('\n');
      } else if (ctx.takePrefix("r"sv)) {
        ctx.appendEscaped('\r');
      } else if (ctx.takePrefix("\\"sv)) {
        ctx.appendEscaped('\\');
      } else if (ctx.takePrefix("\""sv)) {
        ctx.appendEscaped('"');
      } else if (ctx.takePrefix("'"sv)) {
        ctx.appendEscaped('\'');
      } else if (ctx.takePrefix("u{"sv)) {
        auto lexed = hexnum(ctx.next());
        if (!lexed) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        ctx.take(*lexed);
        if (!ctx.takePrefix("}"sv)) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        if (!ctx.appendUnicode(lexed->n)) {
          // TODO: Add error production for invalid unicode values.
          return {};
        }
      } else {
        LexIntCtx ictx(ctx.next());
        if (!ictx.takeHexdigit() || !ictx.takeHexdigit()) {
          // TODO: Add error production for unrecognized escape sequence.
          return {};
        }
        auto lexed = *ictx.lexed();
        ctx.take(lexed);
        ctx.appendEscaped(char(lexed.n));
      }
    } else {
      // Normal characters
      if (uint8_t c = ctx.peek(); c >= 0x20 && c != 0x7F) {
        ctx.takeChar();
      } else {
        // TODO: Add error production for unescaped control characters.
        return {};
      }
    }
  }
  return ctx.lexed();
}